

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

char * afm_stream_read_string(AFM_Stream stream)

{
  byte *pbVar1;
  FT_Int FVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  
  afm_stream_skip_spaces(stream);
  if (stream->status < 2) {
    pbVar1 = stream->cursor + -1;
    pbVar3 = stream->cursor;
    do {
      while( true ) {
        uVar5 = 0xffffffff;
        pbVar4 = pbVar3;
        if (pbVar3 < stream->limit) {
          pbVar4 = pbVar3 + 1;
          stream->cursor = pbVar4;
          uVar5 = (uint)*pbVar3;
        }
        pbVar3 = pbVar4;
        if (0xc < (int)uVar5) break;
        if (uVar5 == 0xffffffff) {
LAB_00234536:
          FVar2 = 3;
          goto LAB_0023453b;
        }
        if (uVar5 == 10) goto LAB_0023452f;
      }
      if (uVar5 == 0x1a) goto LAB_00234536;
    } while (uVar5 != 0xd);
LAB_0023452f:
    FVar2 = 2;
LAB_0023453b:
    stream->status = FVar2;
  }
  else {
    pbVar1 = (byte *)0x0;
  }
  return (char *)pbVar1;
}

Assistant:

static char*
  afm_stream_read_string( AFM_Stream  stream )
  {
    char*  str;


    afm_stream_skip_spaces( stream );
    if ( AFM_STATUS_EOL( stream ) )
      return NULL;

    str = AFM_STREAM_KEY_BEGIN( stream );

    /* scan to eol */
    while ( 1 )
    {
      int  ch = AFM_GETC();


      if ( AFM_IS_NEWLINE( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOL;
        break;
      }
      else if ( AFM_IS_EOF( ch ) )
      {
        stream->status = AFM_STREAM_STATUS_EOF;
        break;
      }
    }

    return str;
  }